

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni_communication.c
# Opt level: O3

void CommProtocolRegisterHooks(CommProtocolHooks *hooks)

{
  if (hooks != (CommProtocolHooks *)0x0) {
    g_hooks.malloc_fn = hooks->malloc_fn;
    g_hooks.free_fn = hooks->free_fn;
    g_hooks.realloc_fn = hooks->realloc_fn;
    g_hooks.sem_alloc_fn = hooks->sem_alloc_fn;
    g_hooks.sem_destroy_fn = hooks->sem_destroy_fn;
    g_hooks.sem_init_fn = hooks->sem_init_fn;
    g_hooks.sem_post_fn = hooks->sem_post_fn;
    g_hooks.sem_wait_fn = hooks->sem_wait_fn;
    g_hooks.sem_timedwait_fn = hooks->sem_timedwait_fn;
    g_hooks.msleep_fn = hooks->msleep_fn;
  }
  return;
}

Assistant:

void CommProtocolRegisterHooks(CommProtocolHooks *hooks) {
  if (NULL == hooks) return;

  /* dynamic memory alloc hooks */
  g_hooks.malloc_fn  = hooks->malloc_fn;
  g_hooks.free_fn    = hooks->free_fn;
  g_hooks.realloc_fn = hooks->realloc_fn;

  /* sleep hook */
  g_hooks.msleep_fn = hooks->msleep_fn;

  /* semaphore hooks */
  g_hooks.sem_alloc_fn     = hooks->sem_alloc_fn;
  g_hooks.sem_destroy_fn   = hooks->sem_destroy_fn;
  g_hooks.sem_init_fn      = hooks->sem_init_fn;
  g_hooks.sem_post_fn      = hooks->sem_post_fn;
  g_hooks.sem_wait_fn      = hooks->sem_wait_fn;
  g_hooks.sem_timedwait_fn = hooks->sem_timedwait_fn;
}